

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O1

Reals __thiscall Omega_h::divide_each_maybe_zero(Omega_h *this,Reals *a,Reals *b)

{
  int *piVar1;
  double dVar2;
  Alloc *pAVar3;
  Alloc *pAVar4;
  uint uVar5;
  int iVar6;
  void *pvVar7;
  Reals *extraout_RDX;
  Reals *extraout_RDX_00;
  size_t sVar8;
  void *pvVar9;
  long lVar10;
  ulong uVar11;
  size_t sVar12;
  Reals RVar13;
  Write<double> c;
  type f;
  Write<double> local_f8;
  Write<double> local_e8;
  string local_d8;
  void *local_b8;
  Alloc *local_b0;
  void *local_a8;
  Alloc *local_a0;
  void *local_98;
  uint local_90;
  Alloc *local_88;
  void *local_80;
  Alloc *local_78;
  void *local_70;
  Alloc *local_68;
  void *pvStack_60;
  uint local_58;
  Alloc *local_50;
  void *pvStack_48;
  Alloc *local_40;
  void *pvStack_38;
  
  pAVar3 = (b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar3 & 1) == 0) {
    uVar11 = pAVar3->size;
  }
  else {
    uVar11 = (ulong)pAVar3 >> 3;
  }
  pAVar4 = (a->write_).shared_alloc_.alloc;
  if ((uVar11 & 0x7fffffff8) == 0) {
    if (((ulong)pAVar4 & 1) == 0) {
      uVar11 = pAVar4->size;
    }
    else {
      uVar11 = (ulong)pAVar4 >> 3;
    }
    if ((uVar11 & 0x7fffffff8) != 0) {
      fail("assertion %s failed at %s +%d\n","a.size() == 0",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array_ops.cpp"
           ,0x8f);
    }
    *(Alloc **)this = pAVar4;
    *(void **)(this + 8) = (a->write_).shared_alloc_.direct_ptr;
    if ((((ulong)pAVar4 & 7) == 0 && pAVar4 != (Alloc *)0x0) && (entering_parallel == '\x01')) {
      pAVar4->use_count = pAVar4->use_count + -1;
      *(size_t *)this = pAVar4->size * 8 + 1;
    }
    (a->write_).shared_alloc_.alloc = (Alloc *)0x0;
    (a->write_).shared_alloc_.direct_ptr = (void *)0x0;
  }
  else {
    if (((ulong)pAVar4 & 1) == 0) {
      sVar12 = pAVar4->size;
    }
    else {
      sVar12 = (ulong)pAVar4 >> 3;
    }
    if (((ulong)pAVar3 & 1) == 0) {
      sVar8 = pAVar3->size;
    }
    else {
      sVar8 = (ulong)pAVar3 >> 3;
    }
    uVar5 = divide_no_remainder<int>((int)(sVar12 >> 3),(int)(sVar8 >> 3));
    pAVar3 = (a->write_).shared_alloc_.alloc;
    if (((ulong)pAVar3 & 1) == 0) {
      sVar12 = pAVar3->size;
    }
    else {
      sVar12 = (ulong)pAVar3 >> 3;
    }
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"");
    Write<double>::Write(&local_f8,(LO)(sVar12 >> 3),&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,
                      CONCAT44(local_d8.field_2._M_allocated_capacity._4_4_,
                               local_d8.field_2._M_allocated_capacity._0_4_) + 1);
    }
    pAVar3 = (b->write_).shared_alloc_.alloc;
    local_a0 = pAVar3;
    if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_a0 = (Alloc *)(pAVar3->size * 8 + 1);
      }
      else {
        pAVar3->use_count = pAVar3->use_count + 1;
      }
    }
    local_98 = (b->write_).shared_alloc_.direct_ptr;
    local_88 = local_f8.shared_alloc_.alloc;
    if (((ulong)local_f8.shared_alloc_.alloc & 7) == 0 &&
        local_f8.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_88 = (Alloc *)((local_f8.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_f8.shared_alloc_.alloc)->use_count = (local_f8.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_80 = local_f8.shared_alloc_.direct_ptr;
    local_78 = (a->write_).shared_alloc_.alloc;
    if (((ulong)local_78 & 7) == 0 && local_78 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_78 = (Alloc *)(local_78->size * 8 + 1);
      }
      else {
        local_78->use_count = local_78->use_count + 1;
      }
    }
    local_70 = (a->write_).shared_alloc_.direct_ptr;
    if (((ulong)pAVar3 & 1) == 0) {
      uVar11 = pAVar3->size;
    }
    else {
      uVar11 = (ulong)pAVar3 >> 3;
    }
    local_68 = local_a0;
    if (((ulong)local_a0 & 7) == 0 && local_a0 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_68 = (Alloc *)(local_a0->size * 8 + 1);
      }
      else {
        local_a0->use_count = local_a0->use_count + 1;
      }
    }
    local_50 = local_88;
    if (((ulong)local_88 & 7) == 0 && local_88 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_50 = (Alloc *)(local_88->size * 8 + 1);
      }
      else {
        local_88->use_count = local_88->use_count + 1;
      }
    }
    pvStack_48 = local_f8.shared_alloc_.direct_ptr;
    local_40 = local_78;
    if (((ulong)local_78 & 7) == 0 && local_78 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_40 = (Alloc *)(local_78->size * 8 + 1);
      }
      else {
        local_78->use_count = local_78->use_count + 1;
      }
    }
    iVar6 = (int)(uVar11 >> 3);
    local_90 = uVar5;
    pvStack_60 = local_98;
    local_58 = uVar5;
    pvStack_38 = local_70;
    if (0 < iVar6) {
      local_d8._M_dataplus._M_p = (pointer)local_68;
      if (((ulong)local_68 & 7) == 0 && local_68 != (Alloc *)0x0) {
        local_68->use_count = local_68->use_count + -1;
        local_d8._M_dataplus._M_p = (pointer)(local_68->size * 8 + 1);
      }
      local_68 = (Alloc *)0x0;
      pvStack_60 = (void *)0x0;
      local_d8.field_2._8_8_ = local_50;
      local_b8 = local_f8.shared_alloc_.direct_ptr;
      if (((ulong)local_50 & 7) == 0 && local_50 != (Alloc *)0x0) {
        local_50->use_count = local_50->use_count + -1;
        local_d8.field_2._8_8_ = local_50->size * 8 + 1;
      }
      local_50 = (Alloc *)0x0;
      pvStack_48 = (void *)0x0;
      local_b0 = local_40;
      if (((ulong)local_40 & 7) == 0 && local_40 != (Alloc *)0x0) {
        local_40->use_count = local_40->use_count + -1;
        local_b0 = (Alloc *)(local_40->size * 8 + 1);
      }
      local_40 = (Alloc *)0x0;
      pvStack_38 = (void *)0x0;
      entering_parallel = '\0';
      lVar10 = 0;
      pvVar7 = local_f8.shared_alloc_.direct_ptr;
      pvVar9 = local_70;
      do {
        dVar2 = *(double *)((long)local_98 + lVar10 * 8);
        local_d8._M_string_length = (size_type)local_98;
        local_d8.field_2._M_allocated_capacity._0_4_ = uVar5;
        local_a8 = local_70;
        if ((dVar2 != 0.0) || (NAN(dVar2))) {
          if (0 < (int)uVar5) {
            uVar11 = 0;
            do {
              *(double *)((long)pvVar7 + uVar11 * 8) =
                   *(double *)((long)pvVar9 + uVar11 * 8) / *(double *)((long)local_98 + lVar10 * 8)
              ;
              uVar11 = uVar11 + 1;
            } while (uVar5 != uVar11);
          }
        }
        else if (0 < (int)uVar5) {
          uVar11 = 0;
          do {
            dVar2 = *(double *)((long)pvVar9 + uVar11 * 8);
            if ((dVar2 != 0.0) || (NAN(dVar2))) {
              fail("assertion %s failed at %s +%d\n","a[i * width + j] == 0.0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array_ops.cpp"
                   ,0x9b);
            }
            *(undefined8 *)((long)pvVar7 + uVar11 * 8) = 0;
            uVar11 = uVar11 + 1;
          } while (uVar5 != uVar11);
        }
        lVar10 = lVar10 + 1;
        pvVar7 = (void *)((long)pvVar7 + (long)(int)uVar5 * 8);
        pvVar9 = (void *)((long)pvVar9 + (long)(int)uVar5 * 8);
      } while ((int)lVar10 != iVar6);
      divide_each_maybe_zero(Omega_h::Read<double>,Omega_h::Read<double>)::$_0::~__0
                ((__0 *)&local_d8);
    }
    divide_each_maybe_zero(Omega_h::Read<double>,Omega_h::Read<double>)::$_0::~__0((__0 *)&local_68)
    ;
    local_e8.shared_alloc_.alloc = local_f8.shared_alloc_.alloc;
    local_e8.shared_alloc_.direct_ptr = local_f8.shared_alloc_.direct_ptr;
    if ((((ulong)local_f8.shared_alloc_.alloc & 7) == 0 &&
         local_f8.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
      (local_f8.shared_alloc_.alloc)->use_count = (local_f8.shared_alloc_.alloc)->use_count + -1;
      local_e8.shared_alloc_.alloc = (Alloc *)((local_f8.shared_alloc_.alloc)->size * 8 + 1);
    }
    local_f8.shared_alloc_.alloc = (Alloc *)0x0;
    local_f8.shared_alloc_.direct_ptr = (void *)0x0;
    Read<double>::Read((Read<signed_char> *)this,&local_e8);
    pAVar3 = local_e8.shared_alloc_.alloc;
    if (((ulong)local_e8.shared_alloc_.alloc & 7) == 0 &&
        local_e8.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_e8.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_e8.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    divide_each_maybe_zero(Omega_h::Read<double>,Omega_h::Read<double>)::$_0::~__0((__0 *)&local_a0)
    ;
    pAVar3 = local_f8.shared_alloc_.alloc;
    b = extraout_RDX;
    if (((ulong)local_f8.shared_alloc_.alloc & 7) == 0 &&
        local_f8.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_f8.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_f8.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
        b = extraout_RDX_00;
      }
    }
  }
  RVar13.write_.shared_alloc_.direct_ptr = b;
  RVar13.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar13.write_.shared_alloc_;
}

Assistant:

Reals divide_each_maybe_zero(Reals a, Reals b) {
  if (b.size() == 0) {
    OMEGA_H_CHECK(a.size() == 0);
    return a;
  }
  auto width = divide_no_remainder(a.size(), b.size());
  Write<Real> c(a.size());
  auto f = OMEGA_H_LAMBDA(LO i) {
    if (b[i] != 0.0) {
      for (Int j = 0; j < width; ++j) {
        c[i * width + j] = a[i * width + j] / b[i];
      }
    } else {
      for (Int j = 0; j < width; ++j) {
        OMEGA_H_CHECK(a[i * width + j] == 0.0);
        c[i * width + j] = 0.0;
      }
    }
  };
  parallel_for(b.size(), f, "divide_maybe_zero");
  return c;
}